

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O2

void __thiscall xray_re::xr_object::save_object(xr_object *this,xr_writer *w)

{
  f_w_const<xray_re::xr_mesh> write;
  f_w_const<xray_re::xr_surface> write_00;
  f_w_const<xray_re::xr_bone> write_01;
  f_w_const<xray_re::xr_skl_motion> write_02;
  f_w_const<xray_re::xr_partition> write_03;
  undefined4 uVar1;
  undefined8 in_RAX;
  undefined8 unaff_RBX;
  undefined4 uVar2;
  
  uVar2 = (undefined4)in_RAX;
  uVar1 = (undefined4)((ulong)in_RAX >> 0x20);
  xr_writer::w_chunk<unsigned_short>(w,0x900,&EOBJ_VERSION);
  xr_writer::w_chunk(w,0x912,&this->m_userdata);
  xr_writer::w_chunk(w,0x925,&this->m_lod_ref);
  xr_writer::w_chunk<unsigned_int>(w,0x903,&this->m_flags);
  xr_writer::open_chunk(w,0x910);
  write.m_f._4_4_ = uVar1;
  write.m_f._0_4_ = uVar2;
  write._8_8_ = unaff_RBX;
  xr_writer::
  w_chunks<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>,xray_re::xr_writer::f_w_const<xray_re::xr_mesh>>
            (w,&this->m_meshes,write);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x907);
  uVar1 = (undefined4)
          ((ulong)((long)(this->m_surfaces).
                         super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_surfaces).
                        super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffdc,4);
  write_00.m_f._4_4_ = uVar1;
  write_00.m_f._0_4_ = uVar2;
  write_00._8_8_ = unaff_RBX;
  xr_writer::
  w_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_writer::f_w_const<xray_re::xr_surface>>
            (w,&this->m_surfaces,write_00);
  xr_writer::close_chunk(w);
  if ((this->m_bones).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_bones).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    xr_writer::open_chunk(w,0x921);
    write_01.m_f._4_4_ = uVar1;
    write_01.m_f._0_4_ = uVar2;
    write_01._8_8_ = unaff_RBX;
    xr_writer::
    w_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_writer::f_w_const<xray_re::xr_bone>>
              (w,&this->m_bones,write_01);
    xr_writer::close_chunk(w);
  }
  if ((this->m_motions).
      super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_motions).
      super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    xr_writer::open_chunk(w,0x916);
    uVar1 = (undefined4)
            ((ulong)((long)(this->m_motions).
                           super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_motions).
                          super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
    (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffdc,4);
    write_02.m_f._4_4_ = uVar1;
    write_02.m_f._0_4_ = uVar2;
    write_02._8_8_ = unaff_RBX;
    xr_writer::
    w_seq<std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>,xray_re::xr_writer::f_w_const<xray_re::xr_skl_motion>>
              (w,&this->m_motions,write_02);
    xr_writer::close_chunk(w);
  }
  if ((this->m_motion_refs)._M_string_length != 0) {
    xr_writer::w_chunk(w,0x924,&this->m_motion_refs);
  }
  if ((this->m_partitions).
      super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_partitions).
      super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    xr_writer::open_chunk(w,0x923);
    uVar1 = (undefined4)
            ((ulong)((long)(this->m_partitions).
                           super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_partitions).
                          super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
    (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffdc,4);
    write_03.m_f._4_4_ = uVar1;
    write_03.m_f._0_4_ = uVar2;
    write_03._8_8_ = unaff_RBX;
    xr_writer::
    w_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,xray_re::xr_writer::f_w_const<xray_re::xr_partition>>
              (w,&this->m_partitions,write_03);
    xr_writer::close_chunk(w);
  }
  if ((this->m_flags & 1) != 0) {
    xr_writer::open_chunk(w,0x920);
    xr_writer::w_fvector3(w,&this->m_position);
    xr_writer::w_fvector3(w,&this->m_rotation);
    xr_writer::close_chunk(w);
  }
  xr_writer::open_chunk(w,0x922);
  xr_writer::w_sz(w,&this->m_owner_name);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffdc,4);
  xr_writer::w_sz(w,&this->m_modif_name);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffdc,4);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_object::save_object(xr_writer& w) const
{
	w.w_chunk<uint16_t>(EOBJ_CHUNK_VERSION, EOBJ_VERSION);

	w.w_chunk(EOBJ_CHUNK_USERDATA, m_userdata);

	w.w_chunk(EOBJ_CHUNK_LOD_REF, m_lod_ref);

	w.w_chunk<uint32_t>(EOBJ_CHUNK_FLAGS, m_flags);

	w.open_chunk(EOBJ_CHUNK_MESHES);
	w.w_chunks(m_meshes, xr_writer::f_w_const<xr_mesh>(&xr_mesh::save));
	w.close_chunk();

	w.open_chunk(EOBJ_CHUNK_SURFACES_2);
	w.w_size_u32(m_surfaces.size());
	w.w_seq(m_surfaces, xr_writer::f_w_const<xr_surface>(&xr_surface::save));
	w.close_chunk();

	if (!m_bones.empty()) {
		w.open_chunk(EOBJ_CHUNK_BONES_1);
		w.w_chunks(m_bones, xr_writer::f_w_const<xr_bone>(&xr_bone::save));
		w.close_chunk();
	}
	if (!m_motions.empty()) {
		w.open_chunk(EOBJ_CHUNK_MOTIONS);
		w.w_size_u32(m_motions.size());
		w.w_seq(m_motions, xr_writer::f_w_const<xr_skl_motion>(&xr_skl_motion::save));
		w.close_chunk();
	}
	if (!m_motion_refs.empty()) {
		w.w_chunk(EOBJ_CHUNK_MOTION_REFS, m_motion_refs);
	}
	if (!m_partitions.empty()) {
		w.open_chunk(EOBJ_CHUNK_PARTITIONS_1);
		w.w_size_u32(m_partitions.size());
		w.w_seq(m_partitions, xr_writer::f_w_const<xr_partition>(&xr_partition::save));
		w.close_chunk();
	}
	if (m_flags & EOF_DYNAMIC) {
		w.open_chunk(EOBJ_CHUNK_TRANSFORM);
		w.w_fvector3(m_position);
		w.w_fvector3(m_rotation);
		w.close_chunk();
	}

	w.open_chunk(EOBJ_CHUNK_REVISION);
	w.w_sz(m_owner_name);
	w.w_u32(m_creation_time);
	w.w_sz(m_modif_name);
	w.w_u32(m_modified_time);
	w.close_chunk();
}